

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

void finish_spawn_return_on_user_stack
               (__cilkrts_worker *w,full_frame *parent_ff,full_frame *child_ff)

{
  full_frame *in_RDX;
  full_frame *in_RSI;
  long in_RDI;
  
  if (*(long *)(*(long *)(in_RDI + 0x38) + 0x128) != 0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                  ,0xd95,"w->l->fiber_to_free == NULL");
  }
  if ((in_RDX->left_sibling == (full_frame *)0x0) && (in_RSI->fiber_child == (cilk_fiber *)0x0)) {
    in_RSI->fiber_child = in_RDX->fiber_self;
    *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x128) = 0;
  }
  else {
    if (in_RSI->fiber_child == in_RDX->fiber_self) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0xd9a,"parent_ff->fiber_child != child_ff->fiber_self");
    }
    *(cilk_fiber **)(*(long *)(in_RDI + 0x38) + 0x128) = in_RDX->fiber_self;
  }
  in_RDX->fiber_self = (cilk_fiber *)0x0;
  unlink_child(in_RSI,in_RDX);
  return;
}

Assistant:

static inline
void finish_spawn_return_on_user_stack(__cilkrts_worker *w,
                                       full_frame *parent_ff,
                                       full_frame *child_ff)
{
    CILK_ASSERT(w->l->fiber_to_free == NULL);

    // Execute left-holder logic for stacks.
    if (child_ff->left_sibling || parent_ff->fiber_child) {
        // Case where we are not the leftmost stack.
        CILK_ASSERT(parent_ff->fiber_child != child_ff->fiber_self);

        // Remember any fiber we need to free in the worker.
        // After we jump into the runtime, we will actually do the
        // free.
        w->l->fiber_to_free = child_ff->fiber_self;
    }
    else {
        // We are leftmost, pass stack/fiber up to parent.
        // Thus, no stack/fiber to free.
        parent_ff->fiber_child = child_ff->fiber_self;
        w->l->fiber_to_free = NULL;
    }

    child_ff->fiber_self = NULL;

    unlink_child(parent_ff, child_ff);
}